

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_uint64 drwav_read_s32__ima(drwav *pWav,drwav_uint64 samplesToRead,drwav_int32 *pBufferOut)

{
  drwav_uint64 dVar1;
  size_t i;
  drwav_uint64 dVar2;
  drwav_uint64 dVar3;
  drwav_int16 samples16 [2048];
  ushort local_1038 [2052];
  
  dVar3 = 0;
  do {
    if (samplesToRead == 0) {
      return dVar3;
    }
    dVar1 = 0x800;
    if (samplesToRead < 0x800) {
      dVar1 = samplesToRead;
    }
    dVar1 = drwav_read_s16(pWav,dVar1,(drwav_int16 *)local_1038);
    if (dVar1 != 0) {
      if (pBufferOut != (drwav_int32 *)0x0) {
        dVar2 = 0;
        do {
          pBufferOut[dVar2] = (uint)local_1038[dVar2] << 0x10;
          dVar2 = dVar2 + 1;
        } while (dVar1 != dVar2);
      }
      pBufferOut = pBufferOut + dVar1;
      samplesToRead = samplesToRead - dVar1;
      dVar3 = dVar3 + dVar1;
    }
  } while (dVar1 != 0);
  return dVar3;
}

Assistant:

drwav_uint64 drwav_read_s32__ima(drwav* pWav, drwav_uint64 samplesToRead, drwav_int32* pBufferOut) {
    // We're just going to borrow the implementation from the drwav_read_s16() since IMA-ADPCM is a little bit more
    // complicated than other formats and I don't want to duplicate that code.
    drwav_uint64 totalSamplesRead = 0;
    drwav_int16 samples16[2048];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead = drwav_read_s16(pWav, drwav_min(samplesToRead, 2048), samples16);
        if (samplesRead == 0) {
            break;
        }

        drwav_s16_to_s32(pBufferOut, samples16, (size_t)samplesRead);  // <-- Safe cast because we're clamping to 2048.

        pBufferOut += samplesRead;
        samplesToRead -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}